

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmhash.cpp
# Opt level: O0

uint __thiscall CVmHashFuncCI::compute_hash(CVmHashFuncCI *this,char *s,size_t l)

{
  int iVar1;
  long in_RDX;
  char *in_RSI;
  uchar c;
  uint acc;
  wchar_t local_24;
  uint local_1c;
  long local_18;
  char *local_10;
  
  local_1c = 0;
  local_10 = in_RSI;
  for (local_18 = in_RDX; local_18 != 0; local_18 = local_18 + -1) {
    iVar1 = is_lower(L'\0');
    if (iVar1 == 0) {
      local_24 = (wchar_t)*local_10;
    }
    else {
      local_24 = to_upper(L'\0');
    }
    local_1c = (local_24 & 0xffU) + local_1c;
    local_10 = local_10 + 1;
  }
  return local_1c;
}

Assistant:

unsigned int CVmHashFuncCI::compute_hash(const char *s, size_t l) const
{
    uint acc;

    /*
     *   Add up all the character values in the string, converting all
     *   characters to upper-case.
     */
    for (acc = 0 ; l != 0 ; ++s, --l)
    {
        uchar c;

        c = (uchar)(is_lower(*s) ? to_upper(*s) : *s);
        acc += c;
    }

    /* return the accumulated value */
    return acc;
}